

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph_test.cc
# Opt level: O0

Test * GraphTestImplicitOutputOnlyMissing::Create(void)

{
  Test *this;
  
  this = (Test *)operator_new(0x228);
  GraphTestImplicitOutputOnlyMissing((GraphTestImplicitOutputOnlyMissing *)this);
  g_current_test = this;
  return this;
}

Assistant:

TEST_F(GraphTest, ImplicitOutputOnlyMissing) {
  ASSERT_NO_FATAL_FAILURE(AssertParse(&state_,
"build | out.imp: cat in\n"));
  fs_.Create("in", "");

  string err;
  EXPECT_TRUE(scan_.RecomputeDirty(GetNode("out.imp"), &err));
  ASSERT_EQ("", err);

  EXPECT_TRUE(GetNode("out.imp")->dirty());
}